

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_parser.cpp
# Opt level: O3

void __thiscall
Parser_parseSineModelFromFile_Test::TestBody(Parser_parseSineModelFromFile_Test *this)

{
  char cVar1;
  char *pcVar2;
  AssertionResult gtest_ar;
  ParserPtr p;
  unsigned_long local_78;
  long *local_70 [2];
  long local_60 [2];
  string local_50;
  undefined7 uStack_4f;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48;
  long local_40 [2];
  undefined1 local_30 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_28;
  string local_20 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_18;
  
  libcellml::Parser::create(SUB81(local_30,0));
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"sine_approximations.xml","");
  fileContents(&local_50);
  libcellml::Parser::parseModel(local_20);
  if (local_18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_18);
  }
  if ((long *)CONCAT71(uStack_4f,local_50) != local_40) {
    operator_delete((long *)CONCAT71(uStack_4f,local_50),local_40[0] + 1);
  }
  if (local_70[0] != local_60) {
    operator_delete(local_70[0],local_60[0] + 1);
  }
  local_70[0] = (long *)0x0;
  local_78 = libcellml::Logger::issueCount();
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&local_50,"size_t(0)","p->issueCount()",(unsigned_long *)local_70,&local_78
            );
  if (local_50 == (string)0x0) {
    testing::Message::Message((Message *)local_70);
    if (local_48.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_48.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/parser/file_parser.cpp"
               ,0x21,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_78,(Message *)local_70);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_78);
    if (local_70[0] != (long *)0x0) {
      cVar1 = testing::internal::IsTrue(true);
      if ((cVar1 != '\0') && (local_70[0] != (long *)0x0)) {
        (**(code **)(*local_70[0] + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_48,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28);
  }
  return;
}

Assistant:

TEST(Parser, parseSineModelFromFile)
{
    libcellml::ParserPtr p = libcellml::Parser::create();
    p->parseModel(fileContents("sine_approximations.xml"));

    EXPECT_EQ(size_t(0), p->issueCount());
}